

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

void __thiscall
cnn::SimpleRNNBuilder::SimpleRNNBuilder
          (SimpleRNNBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model,
          bool support_lags)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<cnn::Parameters_*> __l;
  Parameters *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  Dim *in_R8;
  byte in_R9B;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  Parameters *p_hb;
  Parameters *p_h2h;
  Parameters *p_x2h;
  uint i;
  uint layer_input_dim;
  RNNBuilder *in_stack_fffffffffffffdf0;
  Dim *pDVar1;
  value_type *__x;
  Parameters *in_stack_fffffffffffffe10;
  Dim *in_stack_fffffffffffffe18;
  Parameters *in_stack_fffffffffffffe20;
  undefined8 *puVar2;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 *local_1a0;
  undefined8 local_198;
  Parameters *local_168;
  undefined1 local_159 [25];
  undefined1 *local_140;
  undefined8 local_138;
  undefined4 local_114;
  undefined4 *local_110;
  undefined8 local_108;
  Parameters *local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 *local_c8;
  undefined8 local_c0;
  Parameters *local_90;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 *local_70;
  undefined8 local_68;
  Parameters *local_38;
  uint local_2c;
  undefined4 local_28;
  byte local_21;
  Dim *local_20;
  undefined4 local_14;
  undefined4 local_10;
  uint local_c;
  
  local_21 = in_R9B & 1;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  RNNBuilder::RNNBuilder(in_stack_fffffffffffffdf0);
  *in_RDI = &PTR__SimpleRNNBuilder_007f5628;
  puVar2 = in_RDI + 5;
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::vector((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
            *)0x6b902b);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)0x6b903e);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)0x6b9051);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x6b9064);
  *(uint *)(in_RDI + 0x11) = local_c;
  *(byte *)((long)in_RDI + 0x8c) = local_21 & 1;
  local_28 = local_10;
  for (local_2c = 0; local_2c < local_c; local_2c = local_2c + 1) {
    local_78 = local_14;
    local_74 = local_28;
    local_70 = &local_78;
    local_68 = 2;
    x._M_len = (size_type)in_stack_fffffffffffffe20;
    x._M_array = in_stack_fffffffffffffe18->d;
    pDVar1 = local_20;
    Dim::Dim((Dim *)in_stack_fffffffffffffe10,x);
    in_stack_fffffffffffffe20 =
         Model::add_parameters
                   ((Model *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                    (float)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    local_d0 = local_14;
    local_cc = local_14;
    local_c8 = &local_d0;
    local_c0 = 2;
    x_00._M_len = (size_type)in_stack_fffffffffffffe20;
    x_00._M_array = local_20->d;
    in_stack_fffffffffffffe18 = local_20;
    local_38 = in_stack_fffffffffffffe20;
    Dim::Dim((Dim *)in_stack_fffffffffffffe10,x_00);
    in_stack_fffffffffffffe10 =
         Model::add_parameters
                   ((Model *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                    (float)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    local_114 = local_14;
    local_110 = &local_114;
    local_108 = 1;
    x_01._M_len = (size_type)in_stack_fffffffffffffe20;
    x_01._M_array = in_stack_fffffffffffffe18->d;
    local_90 = in_stack_fffffffffffffe10;
    Dim::Dim((Dim *)in_stack_fffffffffffffe10,x_01);
    this_00 = Model::add_parameters
                        ((Model *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         (float)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    local_159._1_8_ = local_38;
    local_159._9_8_ = local_90;
    local_140 = local_159 + 1;
    local_138 = 3;
    __x = (value_type *)local_159;
    local_159._17_8_ = this_00;
    local_d8 = this_00;
    std::allocator<cnn::Parameters_*>::allocator((allocator<cnn::Parameters_*> *)0x6b92ad);
    __l._M_len = (size_type)puVar2;
    __l._M_array = (iterator)pDVar1;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
               in_stack_fffffffffffffe20,__l,(allocator_type *)in_stack_fffffffffffffe18);
    std::allocator<cnn::Parameters_*>::~allocator((allocator<cnn::Parameters_*> *)0x6b92de);
    if ((*(byte *)((long)in_RDI + 0x8c) & 1) != 0) {
      local_1a8 = local_14;
      local_1a4 = local_14;
      local_1a0 = &local_1a8;
      local_198 = 2;
      x_02._M_len = (size_type)in_stack_fffffffffffffe20;
      x_02._M_array = in_stack_fffffffffffffe18->d;
      pDVar1 = local_20;
      Dim::Dim((Dim *)in_stack_fffffffffffffe10,x_02);
      local_168 = Model::add_parameters
                            ((Model *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                             (float)((ulong)in_stack_fffffffffffffe10 >> 0x20));
      std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::push_back
                ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)pDVar1,
                 (value_type *)local_168);
    }
    std::
    vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
    ::push_back((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                 *)this_00,__x);
    local_28 = local_14;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)this_00);
  }
  return;
}

Assistant:

SimpleRNNBuilder::SimpleRNNBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       Model* model,
                       bool support_lags) : layers(layers), lagging(support_lags) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    Parameters* p_x2h = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2h = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_hb = model->add_parameters({hidden_dim});
    vector<Parameters*> ps = {p_x2h, p_h2h, p_hb};
    if (lagging)
        ps.push_back(model->add_parameters({hidden_dim, hidden_dim}));
    params.push_back(ps);
    layer_input_dim = hidden_dim;
  }
}